

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O0

bool __thiscall Type::AddSizeVar(Type *this,Output *out_cc,Env *env)

{
  FILE *__stream;
  int iVar1;
  ID *pIVar2;
  char *pcVar3;
  Type *pTVar4;
  Field *pFVar5;
  Type *id;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Type *in_RDI;
  ID *size_var_id;
  Type *in_stack_ffffffffffffff50;
  FILE *in_stack_ffffffffffffff60;
  char *local_90;
  Type *in_stack_ffffffffffffff80;
  string local_48 [32];
  Type *local_28;
  undefined8 local_20;
  undefined8 local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pIVar2 = size_var(in_stack_ffffffffffffff50);
  __stream = _stderr;
  if (pIVar2 == (ID *)0x0) {
    iVar1 = (*(in_RDI->super_DataDepElement)._vptr_DataDepElement[0x13])(in_RDI,local_20);
    if (iVar1 < 0) {
      pTVar4 = (Type *)operator_new(0x78);
      pIVar2 = value_var(in_RDI);
      if (pIVar2 == (ID *)0x0) {
        decl_id(in_RDI);
        local_90 = ID::Name((ID *)0x150a1f);
      }
      else {
        in_stack_ffffffffffffff80 = (Type *)value_var(in_RDI);
        local_90 = ID::Name((ID *)0x1509fa);
      }
      strfmt_abi_cxx11_((char *)local_48,"%s__size",local_90);
      ID::ID(pIVar2,(string *)pTVar4);
      std::__cxx11::string::~string(local_48);
      local_28 = pTVar4;
      if ((FLAGS_pac_debug & 1U) != 0) {
        in_stack_ffffffffffffff60 = _stderr;
        pcVar3 = ID::Name((ID *)0x150aa5);
        fprintf(in_stack_ffffffffffffff60,"adding size var `%s\' to env %p\n",pcVar3,local_20);
      }
      pFVar5 = (Field *)operator_new(0xa0);
      pTVar4 = local_28;
      id = Clone(in_stack_ffffffffffffff80);
      TempVarField::TempVarField((TempVarField *)in_stack_ffffffffffffff60,(ID *)id,pTVar4);
      in_RDI->size_var_field_ = pFVar5;
      (*(in_RDI->size_var_field_->super_DataDepElement)._vptr_DataDepElement[4])
                (in_RDI->size_var_field_,local_20);
      (*(in_RDI->size_var_field_->super_DataDepElement)._vptr_DataDepElement[7])
                (in_RDI->size_var_field_,local_18,local_20);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    if ((FLAGS_pac_debug & 1U) != 0) {
      size_var(in_stack_ffffffffffffff50);
      pcVar3 = ID::Name((ID *)0x150964);
      fprintf(__stream,"size var `%s\' already added\n",pcVar3);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Type::AddSizeVar(Output* out_cc, Env* env)
	{
	if ( size_var() )
		{
		DEBUG_MSG("size var `%s' already added\n", size_var()->Name());
		ASSERT(env->Evaluated(size_var()));
		return false;
		}

	if ( StaticSize(env) >= 0 )
		return false;

	ASSERT(! incremental_input());

	ID* size_var_id = new ID(
		strfmt("%s__size", value_var() ? value_var()->Name() : decl_id()->Name()));

	DEBUG_MSG("adding size var `%s' to env %p\n", size_var_id->Name(), env);

	size_var_field_ = new TempVarField(size_var_id, extern_type_int->Clone());
	size_var_field_->Prepare(env);
	size_var_field_->GenTempDecls(out_cc, env);

	return true;
	}